

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O2

EExpr * __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
AssignResult2Args<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::CountId>>
          (EExpr *__return_storage_ptr__,
          ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
          *this,CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CountId>
                *fc)

{
  VarOrConst VVar1;
  
  VVar1 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
          ::
          AssignResult2Args<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::CountId>>
                    ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
                      *)(this + 0x3f8),fc);
  if (((undefined1  [16])VVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    QuadAndLinTerms::QuadAndLinTerms((QuadAndLinTerms *)__return_storage_ptr__);
    (__return_storage_ptr__->super_QuadraticExpr).constant_term_ = (double)VVar1.field_1;
  }
  else {
    AlgebraicExpression<mp::QuadAndLinTerms>::AlgebraicExpression
              (&__return_storage_ptr__->super_QuadraticExpr,(Variable)VVar1.field_1._0_4_);
  }
  return __return_storage_ptr__;
}

Assistant:

EExpr AssignResult2Args(FuncConstraint&& fc) {
    auto vc = GetFlatCvt().AssignResult2Args(
          std::forward<FuncConstraint>(fc));
    return vc.is_var() ? EExpr{ EExpr::Variable{ vc.get_var() } } :
                         EExpr{ EExpr::Constant{ vc.get_const() } };
  }